

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O3

int __thiscall Js::TypePath::Data::Add<true>(Data *this,PropertyRecord *propId,Type *assignments)

{
  Type *addr;
  byte value;
  int iVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  undefined4 *puVar7;
  uint uVar8;
  ulong uVar9;
  
  value = this->pathLength;
  bVar5 = this->pathSize;
  if (bVar5 <= value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x9b,"(currentPathLength < this->pathSize)",
                                "currentPathLength < this->pathSize");
    if (!bVar4) goto LAB_00c34b50;
    *puVar7 = 0;
    bVar5 = this->pathSize;
  }
  if (bVar5 <= value) {
    Throw::InternalError();
  }
  iVar1 = propId->pid;
  bVar5 = *(byte *)((long)(this->map).bucketsData +
                   ((ulong)((long)iVar1 * -0x61c8864680b583eb) >> 0x3c));
  if (bVar5 != 0xff) {
    uVar8 = bVar5 & 0x7f;
    uVar9 = (ulong)uVar8;
    if ((assignments[uVar9].ptr)->pid == iVar1) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    else {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        if ((char)bVar5 < '\0') goto LAB_00c34b07;
        bVar5 = *(byte *)((long)(&this->map + 1) + uVar9);
        bVar6 = bVar5 & 0x7f;
        uVar3 = (uint)bVar6;
        if ((bVar5 != 0xff) && (bVar6 == (byte)uVar8)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                      ,0x59,"(next[idx] == NIL || (next[idx] & 127) != idx)",
                                      "next[idx] == NIL || (next[idx] & 127) != idx");
          if (!bVar4) goto LAB_00c34b50;
          *puVar7 = 0;
          bVar5 = *(byte *)((long)(&this->map + 1) + uVar9);
          uVar3 = (uint)(bVar5 & 0x7f);
        }
        uVar8 = uVar3;
        uVar9 = (ulong)(byte)uVar8;
      } while ((assignments[uVar9].ptr)->pid != iVar1);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0xa7,"(false)","Adding a duplicate to the type path");
    if (!bVar4) {
LAB_00c34b50:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
LAB_00c34b07:
  TinyDictionary::Add(&this->map,propId->pid,value);
  addr = assignments + (uint)value;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = propId;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->pathLength = this->pathLength + '\x01';
  return (uint)value;
}

Assistant:

int Add(const PropertyRecord* propId, Field(const PropertyRecord *)* assignments)
            {
                uint currentPathLength = this->pathLength;
                Assert(currentPathLength < this->pathSize);
                if (currentPathLength >= this->pathSize)
                {
                    Throw::InternalError();
                }

                if (addNewId)
                {
#if DBG
                    PropertyIndex temp;
                    if (this->map.TryGetValue(propId->GetPropertyId(), &temp, assignments))
                    {
                        AssertMsg(false, "Adding a duplicate to the type path");
                    }
#endif
                    this->map.Add((unsigned int)propId->GetPropertyId(), (byte)currentPathLength);
                }
                assignments[currentPathLength] = propId;
                this->pathLength++;
                return currentPathLength;
            }